

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O2

BYTE * EmitLEB128(BYTE *pc,int value)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  
  bVar1 = true;
  while (bVar1) {
    bVar3 = (byte)value & 0x7f;
    uVar2 = value >> 7;
    if (0x3fU < (uint)value) {
      bVar3 = bVar3 | (uVar2 != 0xffffffff || (value & 0x40U) == 0) << 7;
    }
    bVar1 = 0x3fU < (uint)value && (uVar2 != 0xffffffff || (value & 0x40U) == 0);
    *pc = bVar3;
    pc = pc + 1;
    value = uVar2;
  }
  return pc;
}

Assistant:

BYTE* EmitLEB128(BYTE* pc, int value)
{
    static const int size = sizeof(value) * 8;
    static const bool isLogicShift = (-1 >> 1) != -1;

    const bool signExtend = isLogicShift && value < 0;

    bool more = true;
    while (more)
    {
        BYTE b = value & 0x7F; // low order 7 bits
        value >>= 7;

        if (signExtend)
        {
            value |= - (1 << (size - 7)); // sign extend
        }

        const bool signBit = (b & 0x40) != 0;
        if ((value == 0 && !signBit) || (value == -1 && signBit))
        {
            more = false;
        }
        else
        {
            b |= 0x80;
        }

        *pc++ = b;
    }

    return pc;
}